

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<capnp::Orphan<capnp::compiler::Token>_>::Maybe
          (Maybe<capnp::Orphan<capnp::compiler::Token>_> *this,
          Maybe<capnp::Orphan<capnp::compiler::Token>_> *other)

{
  NullableValue<capnp::Orphan<capnp::compiler::Token>_> *other_00;
  Maybe<capnp::Orphan<capnp::compiler::Token>_> *other_local;
  Maybe<capnp::Orphan<capnp::compiler::Token>_> *this_local;
  
  other_00 = mv<kj::_::NullableValue<capnp::Orphan<capnp::compiler::Token>>>(&other->ptr);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Token>_>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }